

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

void __thiscall minihttp::HttpSocket::_ParseHeaderFields(HttpSocket *this,char *s,size_t size)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  char *__s;
  char *pcVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *__s_00;
  string key;
  string valstr;
  
  pcVar7 = s;
  do {
    __s_00 = pcVar7;
    if (s + size <= pcVar7) {
      return;
    }
    while (iVar3 = isspace((int)*__s_00), iVar3 != 0) {
      __s_00 = __s_00 + 1;
      pcVar7 = pcVar7 + 1;
      if (s + size <= __s_00) {
        return;
      }
    }
    __s = strchr(__s_00,0x3a);
    if (__s == (char *)0x0) {
      return;
    }
    pcVar4 = strchr(__s,10);
    pcVar9 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      return;
    }
    for (; (pcVar4[-1] == '\n' || (pcVar8 = __s, pcVar4[-1] == '\r')); pcVar4 = pcVar4 + -1) {
      pcVar9 = pcVar9 + -1;
    }
    do {
      pcVar8 = pcVar8 + 1;
      iVar3 = isspace((int)*pcVar8);
      if (pcVar4 <= pcVar8) break;
    } while (iVar3 != 0);
    key._M_dataplus._M_p = (pointer)&key.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&key,__s_00,__s_00 + ((long)__s - (long)pcVar7));
    sVar2 = key._M_string_length;
    _Var1._M_p = key._M_dataplus._M_p;
    for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
      iVar3 = tolower((int)_Var1._M_p[sVar6]);
      _Var1._M_p[sVar6] = (char)iVar3;
    }
    valstr._M_dataplus._M_p = (pointer)&valstr.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&valstr,pcVar8,pcVar9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->_hdrs,&key);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&valstr);
    std::__cxx11::string::~string((string *)&key);
    pcVar7 = pcVar4;
  } while( true );
}

Assistant:

void HttpSocket::_ParseHeaderFields(const char *s, size_t size)
{
    // Key: Value data\r\n

    const char * const maxs = s + size;
    while(s < maxs)
    {
        while(isspace(*s))
        {
            ++s;
            if(s >= maxs)
                return;
        }
        const char * const colon = strchr(s, ':');
        if(!colon)
            return;
        const char *valEnd = strchr(colon, '\n'); // last char of val data
        if(!valEnd)
            return;
        while(valEnd[-1] == '\n' || valEnd[-1] == '\r') // skip backwards if necessary
            --valEnd;
        const char *val = colon + 1; // value starts after ':' ...
        while(isspace(*val) && val < valEnd) // skip spaces after the colon
            ++val;
        std::string key(s, colon - s);
        strToLower(key);
        std::string valstr(val, valEnd - val);
        _hdrs[key] = valstr;
        traceprint("HDR: %s: %s\n", key.c_str(), valstr.c_str());
        s = valEnd;
    }
}